

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

bool dirDEFARRAY_parseItems(CStringsList **nextPtr)

{
  char *badValueMessage;
  bool bVar1;
  int iVar2;
  CStringsList *this;
  char *n;
  char ml [2048];
  char *local_840;
  char local_838 [2056];
  
  while( true ) {
    badValueMessage = lp;
    local_840 = local_838;
    iVar2 = GetMacroArgumentValue(&lp,&local_840);
    if (iVar2 == 0) {
      Error("[DEFARRAY] Syntax error",badValueMessage,SUPPRESS);
    }
    else {
      this = (CStringsList *)operator_new(0x28);
      CStringsList::CStringsList(this,local_838,(CStringsList *)0x0);
      *nextPtr = this;
      if (this->string == (char *)0x0) {
        ErrorOOM();
      }
      nextPtr = &(*nextPtr)->next;
    }
    if (iVar2 == 0) break;
    bVar1 = anyComma(&lp);
    if (!bVar1) {
      iVar2 = SkipBlanks();
      return iVar2 != 0;
    }
  }
  return false;
}

Assistant:

static bool dirDEFARRAY_parseItems(CStringsList** nextPtr) {
	char ml[LINEMAX];
	do {
		const char* const itemLp = lp;
		char* n = ml;
		if (!GetMacroArgumentValue(lp, n)) {
			Error("[DEFARRAY] Syntax error", itemLp, SUPPRESS);
			return false;
		}
		*nextPtr = new CStringsList(ml);
		if ((*nextPtr)->string == NULL) ErrorOOM();
		nextPtr = &((*nextPtr)->next);
	} while (anyComma(lp));
	return SkipBlanks();
}